

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_predicate_for_stream_send(nghttp2_session *session,nghttp2_stream *stream)

{
  int iVar1;
  nghttp2_stream *stream_local;
  nghttp2_session *session_local;
  
  if (stream == (nghttp2_stream *)0x0) {
    session_local._4_4_ = -0x1fe;
  }
  else {
    iVar1 = session_is_closing(session);
    if (iVar1 == 0) {
      if ((stream->shut_flags & 2) == 0) {
        session_local._4_4_ = 0;
      }
      else {
        session_local._4_4_ = -0x200;
      }
    }
    else {
      session_local._4_4_ = -0x212;
    }
  }
  return session_local._4_4_;
}

Assistant:

static int session_predicate_for_stream_send(nghttp2_session *session,
                                             nghttp2_stream *stream) {
  if (stream == NULL) {
    return NGHTTP2_ERR_STREAM_CLOSED;
  }
  if (session_is_closing(session)) {
    return NGHTTP2_ERR_SESSION_CLOSING;
  }
  if (stream->shut_flags & NGHTTP2_SHUT_WR) {
    return NGHTTP2_ERR_STREAM_SHUT_WR;
  }
  return 0;
}